

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O0

void aom_highbd_lpf_vertical_4_sse2
               (uint16_t *s,int p,uint8_t *blimit,uint8_t *limit,uint8_t *thresh,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 uVar8;
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int in_ESI;
  long in_RDI;
  uint8_t *in_R8;
  uint in_R9D;
  ushort uVar9;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ushort uVar20;
  undefined1 auVar12 [16];
  __m128i alVar13;
  undefined1 auVar21 [16];
  __m128i q1;
  __m128i p1;
  __m128i q1q0;
  __m128i p1p0;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  __m128i t80;
  __m128i abs_p1p0;
  __m128i pq [2];
  __m128i q1q0_1;
  __m128i p1p0_1;
  __m128i hev;
  __m128i mask;
  __m128i thresh_1;
  __m128i limit_1;
  __m128i blimit_1;
  __m128i filter1filt;
  __m128i filter2filt;
  __m128i filter2filter1;
  __m128i filt;
  __m128i work;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i t3t4;
  __m128i pmin;
  __m128i pmax;
  __m128i one;
  __m128i zero;
  __m128i *blt;
  __m128i *lt;
  __m128i *t80_out;
  __m128i *d3_00;
  __m128i *d2_00;
  __m128i *pq_00;
  longlong local_9b8 [3];
  undefined8 uStack_9a0;
  longlong local_998;
  longlong lStack_990;
  longlong local_988;
  longlong lStack_980;
  longlong local_978 [2];
  longlong local_968 [2];
  longlong local_958 [2];
  longlong local_948 [2];
  longlong local_938 [3];
  undefined8 uStack_920;
  longlong local_918 [3];
  undefined8 uStack_900;
  uint local_8f4;
  uint8_t *local_8f0;
  uint8_t *local_8e8;
  uint8_t *local_8e0;
  int local_8d4;
  long local_8d0;
  longlong local_8c8;
  undefined8 uStack_8c0;
  longlong *local_8b0;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 *local_890;
  longlong local_888;
  undefined8 uStack_880;
  longlong *local_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 *local_850;
  longlong local_7c8 [4];
  longlong local_7a8;
  longlong lStack_7a0;
  longlong local_798;
  longlong lStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  ulong local_768;
  ulong uStack_760;
  ulong local_758 [2];
  longlong local_748 [2];
  longlong local_738 [2];
  longlong local_728 [2];
  uint local_714;
  uint8_t *local_710;
  uint8_t *local_708;
  uint8_t *local_700;
  __m128i *local_6f8;
  __m128i *local_6f0;
  __m128i *local_6e8;
  __m128i *local_6e0;
  __m128i *local_6d8;
  __m128i *local_6d0;
  longlong local_6c8;
  longlong lStack_6c0;
  longlong local_6b8;
  longlong lStack_6b0;
  longlong local_6a8;
  longlong lStack_6a0;
  longlong local_698;
  longlong lStack_690;
  undefined8 local_688;
  ulong uStack_680;
  undefined8 local_678;
  undefined4 uStack_66c;
  undefined1 local_668 [16];
  undefined8 local_658;
  undefined8 uStack_650;
  undefined1 local_648 [16];
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  undefined8 local_618;
  undefined8 uStack_610;
  undefined1 local_608 [16];
  undefined1 local_5f8 [16];
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  uint local_5c4;
  __m128i *local_5c0;
  __m128i *local_5b8;
  __m128i *local_5b0;
  ulong *local_5a8;
  ulong *local_5a0;
  undefined8 *local_598;
  undefined8 *local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  ulong local_578;
  ulong uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  __m128i *in_stack_fffffffffffffab0;
  __m128i *in_stack_fffffffffffffab8;
  __m128i *in_stack_fffffffffffffac0;
  __m128i *in_stack_fffffffffffffac8;
  undefined4 uStack_4c0;
  undefined4 uStack_4b0;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_38;
  short sStack_36;
  short sStack_34;
  short sStack_32;
  short sStack_30;
  short sStack_2e;
  short sStack_2c;
  short sStack_2a;
  
  local_850 = (undefined8 *)(in_RDI + -4);
  local_918[2] = *local_850;
  uStack_860 = 0;
  uStack_900 = 0;
  local_870 = (longlong *)(in_RDI + -4 + (long)in_ESI * 2);
  local_918[0] = *local_870;
  uStack_880 = 0;
  local_918[1] = 0;
  local_890 = (undefined8 *)(in_RDI + -4 + (long)(in_ESI * 2) * 2);
  local_938[2] = *local_890;
  uStack_8a0 = 0;
  uStack_920 = 0;
  local_8b0 = (longlong *)(in_RDI + -4 + (long)(in_ESI * 3) * 2);
  local_938[0] = *local_8b0;
  uStack_8c0 = 0;
  local_938[1] = 0;
  d3_00 = &local_978;
  d2_00 = &local_968;
  local_8f4 = in_R9D;
  local_8f0 = in_R8;
  local_8e8 = in_RCX;
  local_8e0 = in_RDX;
  local_8d4 = in_ESI;
  local_8d0 = in_RDI;
  local_8c8 = local_938[0];
  local_8a8 = local_938[2];
  local_888 = local_918[0];
  local_868 = local_918[2];
  highbd_transpose4x8_8x4_low_sse2
            ((__m128i *)(local_918 + 2),(__m128i *)local_918,(__m128i *)(local_938 + 2),
             (__m128i *)local_938,&local_948,&local_958,d2_00,d3_00);
  pq_00 = (__m128i *)&local_988;
  local_700 = local_8e0;
  local_708 = local_8e8;
  local_710 = local_8f0;
  local_714 = local_8f4;
  t80_out = (__m128i *)local_7c8;
  blt = &local_728;
  lt = &local_738;
  local_6f8 = pq_00;
  local_6f0 = (__m128i *)&local_998;
  local_6e8 = d3_00;
  local_6e0 = d2_00;
  local_6d8 = &local_958;
  local_6d0 = &local_948;
  get_limit(local_8e0,local_8e8,local_8f0,local_8f4,blt,lt,&local_748,t80_out);
  local_7a8 = (*local_6d8)[0];
  lStack_690 = (*local_6d8)[1];
  lStack_7a0 = (*local_6e0)[0];
  lStack_6a0 = (*local_6e0)[1];
  local_798 = (*local_6d0)[0];
  lStack_6b0 = (*local_6d0)[1];
  lStack_790 = (*local_6e8)[0];
  lStack_6c0 = (*local_6e8)[1];
  local_6c8 = lStack_790;
  local_6b8 = local_798;
  local_6a8 = lStack_7a0;
  local_698 = local_7a8;
  highbd_hev_filter_mask_x_sse2
            (pq_00,(int)((ulong)d2_00 >> 0x20),d3_00,t80_out,lt,blt,in_stack_fffffffffffffab0,
             in_stack_fffffffffffffab8,in_stack_fffffffffffffac0,in_stack_fffffffffffffac8);
  local_5b0 = local_6f0;
  local_5b8 = local_6f8;
  local_5c4 = local_714;
  local_588 = 0;
  uStack_580 = 0;
  local_5d8 = 0;
  uStack_5d0 = 0;
  local_5e8 = 0x1000100010001;
  uStack_5e0 = 0x1000100010001;
  auVar21._8_8_ = 0x1000100010001;
  auVar21._0_8_ = 0x1000100010001;
  auVar21 = psllw(auVar21,ZEXT416(local_714));
  auVar10._8_8_ = 0x1000100010001;
  auVar10._0_8_ = 0x1000100010001;
  auVar21 = psubsw(auVar21,auVar10);
  local_5f8 = psubsw(auVar21,(undefined1  [16])*t80_out);
  local_608 = psubsw(ZEXT816(0),(undefined1  [16])*t80_out);
  local_618 = 0x4000400040004;
  uStack_610 = 0x3000300030003;
  auVar7._8_8_ = uStack_770;
  auVar7._0_8_ = local_778;
  auVar10 = psubsw(auVar7,(undefined1  [16])*t80_out);
  auVar6._8_8_ = uStack_780;
  auVar6._0_8_ = local_788;
  auVar11 = psubsw(auVar6,(undefined1  [16])*t80_out);
  local_648 = psubsw(auVar10,auVar11);
  local_b8 = local_648._0_2_;
  sStack_b6 = local_648._2_2_;
  sStack_b4 = local_648._4_2_;
  sStack_b2 = local_648._6_2_;
  sStack_b0 = local_648._8_2_;
  sStack_ae = local_648._10_2_;
  sStack_ac = local_648._12_2_;
  sStack_aa = local_648._14_2_;
  local_c8 = local_5f8._0_2_;
  sStack_c6 = local_5f8._2_2_;
  sStack_c4 = local_5f8._4_2_;
  sStack_c2 = local_5f8._6_2_;
  sStack_c0 = local_5f8._8_2_;
  sStack_be = local_5f8._10_2_;
  sStack_bc = local_5f8._12_2_;
  sStack_ba = local_5f8._14_2_;
  uVar9 = (ushort)(local_c8 < local_b8) * local_c8 | (ushort)(local_c8 >= local_b8) * local_b8;
  uVar14 = (ushort)(sStack_c6 < sStack_b6) * sStack_c6 |
           (ushort)(sStack_c6 >= sStack_b6) * sStack_b6;
  uVar15 = (ushort)(sStack_c4 < sStack_b4) * sStack_c4 |
           (ushort)(sStack_c4 >= sStack_b4) * sStack_b4;
  uVar16 = (ushort)(sStack_c2 < sStack_b2) * sStack_c2 |
           (ushort)(sStack_c2 >= sStack_b2) * sStack_b2;
  uVar17 = (ushort)(sStack_c0 < sStack_b0) * sStack_c0 |
           (ushort)(sStack_c0 >= sStack_b0) * sStack_b0;
  uVar18 = (ushort)(sStack_be < sStack_ae) * sStack_be |
           (ushort)(sStack_be >= sStack_ae) * sStack_ae;
  uVar19 = (ushort)(sStack_bc < sStack_ac) * sStack_bc |
           (ushort)(sStack_bc >= sStack_ac) * sStack_ac;
  uVar20 = (ushort)(sStack_ba < sStack_aa) * sStack_ba |
           (ushort)(sStack_ba >= sStack_aa) * sStack_aa;
  local_648._0_2_ = uVar9;
  local_648._2_2_ = uVar14;
  local_648._4_2_ = uVar15;
  local_648._6_2_ = uVar16;
  local_648._8_2_ = uVar17;
  local_648._10_2_ = uVar18;
  local_648._12_2_ = uVar19;
  local_648._14_2_ = uVar20;
  local_1c8 = local_608._0_2_;
  sStack_1c6 = local_608._2_2_;
  sStack_1c4 = local_608._4_2_;
  sStack_1c2 = local_608._6_2_;
  sStack_1c0 = local_608._8_2_;
  sStack_1be = local_608._10_2_;
  sStack_1bc = local_608._12_2_;
  sStack_1ba = local_608._14_2_;
  local_648._0_2_ =
       (ushort)((short)uVar9 < local_1c8) * local_1c8 | ((short)uVar9 >= local_1c8) * uVar9;
  local_648._2_2_ =
       (ushort)((short)uVar14 < sStack_1c6) * sStack_1c6 | ((short)uVar14 >= sStack_1c6) * uVar14;
  local_648._4_2_ =
       (ushort)((short)uVar15 < sStack_1c4) * sStack_1c4 | ((short)uVar15 >= sStack_1c4) * uVar15;
  local_648._6_2_ =
       (ushort)((short)uVar16 < sStack_1c2) * sStack_1c2 | ((short)uVar16 >= sStack_1c2) * uVar16;
  local_648._8_2_ =
       (ushort)((short)uVar17 < sStack_1c0) * sStack_1c0 | ((short)uVar17 >= sStack_1c0) * uVar17;
  local_648._10_2_ =
       (ushort)((short)uVar18 < sStack_1be) * sStack_1be | ((short)uVar18 >= sStack_1be) * uVar18;
  local_648._12_2_ =
       (ushort)((short)uVar19 < sStack_1bc) * sStack_1bc | ((short)uVar19 >= sStack_1bc) * uVar19;
  local_648._14_2_ =
       (ushort)((short)uVar20 < sStack_1ba) * sStack_1ba | ((short)uVar20 >= sStack_1ba) * uVar20;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_648._8_8_ & local_768;
  auVar21 = psubsw(auVar1,local_648);
  auVar21 = psubsw(auVar21,local_648);
  auVar21 = psubsw(auVar21,local_648);
  local_658 = auVar21._0_8_;
  local_98 = auVar21._0_2_;
  sStack_96 = auVar21._2_2_;
  sStack_94 = auVar21._4_2_;
  sStack_92 = auVar21._6_2_;
  uVar9 = (ushort)(local_c8 < local_98) * local_c8 | (ushort)(local_c8 >= local_98) * local_98;
  uVar14 = (ushort)(sStack_c6 < sStack_96) * sStack_c6 |
           (ushort)(sStack_c6 >= sStack_96) * sStack_96;
  uVar15 = (ushort)(sStack_c4 < sStack_94) * sStack_c4 |
           (ushort)(sStack_c4 >= sStack_94) * sStack_94;
  uVar16 = (ushort)(sStack_c2 < sStack_92) * sStack_c2 |
           (ushort)(sStack_c2 >= sStack_92) * sStack_92;
  local_658._0_2_ = uVar9;
  local_658._2_2_ = uVar14;
  local_658._4_2_ = uVar15;
  local_658._6_2_ = uVar16;
  local_658._0_2_ =
       (ushort)((short)uVar9 < local_1c8) * local_1c8 | ((short)uVar9 >= local_1c8) * uVar9;
  local_658._2_2_ =
       (ushort)((short)uVar14 < sStack_1c6) * sStack_1c6 | ((short)uVar14 >= sStack_1c6) * uVar14;
  local_658._4_2_ =
       (ushort)((short)uVar15 < sStack_1c4) * sStack_1c4 | ((short)uVar15 >= sStack_1c4) * uVar15;
  local_658._6_2_ =
       (ushort)((short)uVar16 < sStack_1c2) * sStack_1c2 | ((short)uVar16 >= sStack_1c2) * uVar16;
  auVar5._8_8_ = local_658 & local_758[0];
  auVar5._0_8_ = local_658 & local_758[0];
  auVar4._8_8_ = 0x3000300030003;
  auVar4._0_8_ = 0x4000400040004;
  local_668 = paddsw(auVar5,auVar4);
  local_78 = local_668._0_2_;
  sStack_76 = local_668._2_2_;
  sStack_74 = local_668._4_2_;
  sStack_72 = local_668._6_2_;
  sStack_70 = local_668._8_2_;
  sStack_6e = local_668._10_2_;
  sStack_6c = local_668._12_2_;
  sStack_6a = local_668._14_2_;
  uVar9 = (ushort)(local_c8 < local_78) * local_c8 | (ushort)(local_c8 >= local_78) * local_78;
  uVar14 = (ushort)(sStack_c6 < sStack_76) * sStack_c6 |
           (ushort)(sStack_c6 >= sStack_76) * sStack_76;
  uVar15 = (ushort)(sStack_c4 < sStack_74) * sStack_c4 |
           (ushort)(sStack_c4 >= sStack_74) * sStack_74;
  uVar16 = (ushort)(sStack_c2 < sStack_72) * sStack_c2 |
           (ushort)(sStack_c2 >= sStack_72) * sStack_72;
  uVar17 = (ushort)(sStack_c0 < sStack_70) * sStack_c0 |
           (ushort)(sStack_c0 >= sStack_70) * sStack_70;
  uVar18 = (ushort)(sStack_be < sStack_6e) * sStack_be |
           (ushort)(sStack_be >= sStack_6e) * sStack_6e;
  uVar19 = (ushort)(sStack_bc < sStack_6c) * sStack_bc |
           (ushort)(sStack_bc >= sStack_6c) * sStack_6c;
  uVar20 = (ushort)(sStack_ba < sStack_6a) * sStack_ba |
           (ushort)(sStack_ba >= sStack_6a) * sStack_6a;
  local_668._0_2_ = uVar9;
  local_668._2_2_ = uVar14;
  local_668._4_2_ = uVar15;
  local_668._6_2_ = uVar16;
  local_668._8_2_ = uVar17;
  local_668._10_2_ = uVar18;
  local_668._12_2_ = uVar19;
  local_668._14_2_ = uVar20;
  local_668._0_2_ =
       (ushort)((short)uVar9 < local_1c8) * local_1c8 | ((short)uVar9 >= local_1c8) * uVar9;
  local_668._2_2_ =
       (ushort)((short)uVar14 < sStack_1c6) * sStack_1c6 | ((short)uVar14 >= sStack_1c6) * uVar14;
  local_668._4_2_ =
       (ushort)((short)uVar15 < sStack_1c4) * sStack_1c4 | ((short)uVar15 >= sStack_1c4) * uVar15;
  local_668._6_2_ =
       (ushort)((short)uVar16 < sStack_1c2) * sStack_1c2 | ((short)uVar16 >= sStack_1c2) * uVar16;
  local_668._8_2_ =
       (ushort)((short)uVar17 < sStack_1c0) * sStack_1c0 | ((short)uVar17 >= sStack_1c0) * uVar17;
  local_668._10_2_ =
       (ushort)((short)uVar18 < sStack_1be) * sStack_1be | ((short)uVar18 >= sStack_1be) * uVar18;
  local_668._12_2_ =
       (ushort)((short)uVar19 < sStack_1bc) * sStack_1bc | ((short)uVar19 >= sStack_1bc) * uVar19;
  local_668._14_2_ =
       (ushort)((short)uVar20 < sStack_1ba) * sStack_1ba | ((short)uVar20 >= sStack_1ba) * uVar20;
  auVar12 = psraw(local_668,ZEXT416(3));
  local_668._0_8_ = auVar12._0_8_;
  local_668._8_8_ = auVar12._8_8_;
  uStack_560 = local_668._8_8_;
  local_558 = local_668._0_8_;
  auVar3._8_8_ = local_668._0_8_;
  auVar3._0_8_ = local_668._0_8_;
  auVar2._8_8_ = 0x1000100010001;
  auVar2._0_8_ = 0x1000100010001;
  auVar21 = paddsw(auVar3,auVar2);
  auVar21 = psraw(auVar21,ZEXT416(1));
  local_658 = auVar21._0_8_;
  uStack_650 = auVar21._8_8_;
  uStack_680 = ~local_768 & local_658;
  uStack_570 = ~uStack_760 & uStack_650;
  uStack_650 = uStack_570;
  local_658 = uStack_680;
  auVar21 = _local_658;
  local_668._12_4_ = auVar12._12_4_;
  uVar8 = local_668._12_4_;
  uStack_650._4_4_ = (undefined4)(uStack_570 >> 0x20);
  uStack_66c = local_668._12_4_;
  local_668._4_4_ = uStack_650._4_4_;
  local_668._0_4_ = uStack_4c0;
  local_668 = CONCAT88(uStack_560,local_668._0_8_);
  local_568 = local_668._0_8_;
  local_688 = local_668._0_8_;
  auVar12._8_8_ = uStack_680;
  auVar12._0_8_ = local_668._0_8_;
  local_638 = psubsw(auVar11,auVar12);
  auVar11._12_4_ = uVar8;
  auVar11._8_4_ = uStack_4b0;
  auVar11._0_8_ = local_678;
  local_628 = paddsw(auVar10,auVar11);
  local_58 = local_638._0_2_;
  sStack_56 = local_638._2_2_;
  sStack_54 = local_638._4_2_;
  sStack_52 = local_638._6_2_;
  sStack_50 = local_638._8_2_;
  sStack_4e = local_638._10_2_;
  sStack_4c = local_638._12_2_;
  sStack_4a = local_638._14_2_;
  uVar9 = (ushort)(local_c8 < local_58) * local_c8 | (ushort)(local_c8 >= local_58) * local_58;
  uVar14 = (ushort)(sStack_c6 < sStack_56) * sStack_c6 |
           (ushort)(sStack_c6 >= sStack_56) * sStack_56;
  uVar15 = (ushort)(sStack_c4 < sStack_54) * sStack_c4 |
           (ushort)(sStack_c4 >= sStack_54) * sStack_54;
  uVar16 = (ushort)(sStack_c2 < sStack_52) * sStack_c2 |
           (ushort)(sStack_c2 >= sStack_52) * sStack_52;
  uVar17 = (ushort)(sStack_c0 < sStack_50) * sStack_c0 |
           (ushort)(sStack_c0 >= sStack_50) * sStack_50;
  uVar18 = (ushort)(sStack_be < sStack_4e) * sStack_be |
           (ushort)(sStack_be >= sStack_4e) * sStack_4e;
  uVar19 = (ushort)(sStack_bc < sStack_4c) * sStack_bc |
           (ushort)(sStack_bc >= sStack_4c) * sStack_4c;
  uVar20 = (ushort)(sStack_ba < sStack_4a) * sStack_ba |
           (ushort)(sStack_ba >= sStack_4a) * sStack_4a;
  local_638._0_2_ = uVar9;
  local_638._2_2_ = uVar14;
  local_638._4_2_ = uVar15;
  local_638._6_2_ = uVar16;
  local_638._8_2_ = uVar17;
  local_638._10_2_ = uVar18;
  local_638._12_2_ = uVar19;
  local_638._14_2_ = uVar20;
  local_638._0_2_ =
       (ushort)((short)uVar9 < local_1c8) * local_1c8 | ((short)uVar9 >= local_1c8) * uVar9;
  local_638._2_2_ =
       (ushort)((short)uVar14 < sStack_1c6) * sStack_1c6 | ((short)uVar14 >= sStack_1c6) * uVar14;
  local_638._4_2_ =
       (ushort)((short)uVar15 < sStack_1c4) * sStack_1c4 | ((short)uVar15 >= sStack_1c4) * uVar15;
  local_638._6_2_ =
       (ushort)((short)uVar16 < sStack_1c2) * sStack_1c2 | ((short)uVar16 >= sStack_1c2) * uVar16;
  local_638._8_2_ =
       (ushort)((short)uVar17 < sStack_1c0) * sStack_1c0 | ((short)uVar17 >= sStack_1c0) * uVar17;
  local_638._10_2_ =
       (ushort)((short)uVar18 < sStack_1be) * sStack_1be | ((short)uVar18 >= sStack_1be) * uVar18;
  local_638._12_2_ =
       (ushort)((short)uVar19 < sStack_1bc) * sStack_1bc | ((short)uVar19 >= sStack_1bc) * uVar19;
  local_638._14_2_ =
       (ushort)((short)uVar20 < sStack_1ba) * sStack_1ba | ((short)uVar20 >= sStack_1ba) * uVar20;
  local_38 = local_628._0_2_;
  sStack_36 = local_628._2_2_;
  sStack_34 = local_628._4_2_;
  sStack_32 = local_628._6_2_;
  sStack_30 = local_628._8_2_;
  sStack_2e = local_628._10_2_;
  sStack_2c = local_628._12_2_;
  sStack_2a = local_628._14_2_;
  uVar9 = (ushort)(local_c8 < local_38) * local_c8 | (ushort)(local_c8 >= local_38) * local_38;
  uVar14 = (ushort)(sStack_c6 < sStack_36) * sStack_c6 |
           (ushort)(sStack_c6 >= sStack_36) * sStack_36;
  uVar15 = (ushort)(sStack_c4 < sStack_34) * sStack_c4 |
           (ushort)(sStack_c4 >= sStack_34) * sStack_34;
  uVar16 = (ushort)(sStack_c2 < sStack_32) * sStack_c2 |
           (ushort)(sStack_c2 >= sStack_32) * sStack_32;
  uVar17 = (ushort)(sStack_c0 < sStack_30) * sStack_c0 |
           (ushort)(sStack_c0 >= sStack_30) * sStack_30;
  uVar18 = (ushort)(sStack_be < sStack_2e) * sStack_be |
           (ushort)(sStack_be >= sStack_2e) * sStack_2e;
  uVar19 = (ushort)(sStack_bc < sStack_2c) * sStack_bc |
           (ushort)(sStack_bc >= sStack_2c) * sStack_2c;
  uVar20 = (ushort)(sStack_ba < sStack_2a) * sStack_ba |
           (ushort)(sStack_ba >= sStack_2a) * sStack_2a;
  local_628._0_2_ = uVar9;
  local_628._2_2_ = uVar14;
  local_628._4_2_ = uVar15;
  local_628._6_2_ = uVar16;
  local_628._8_2_ = uVar17;
  local_628._10_2_ = uVar18;
  local_628._12_2_ = uVar19;
  local_628._14_2_ = uVar20;
  local_628._0_2_ =
       (ushort)((short)uVar9 < local_1c8) * local_1c8 | ((short)uVar9 >= local_1c8) * uVar9;
  local_628._2_2_ =
       (ushort)((short)uVar14 < sStack_1c6) * sStack_1c6 | ((short)uVar14 >= sStack_1c6) * uVar14;
  local_628._4_2_ =
       (ushort)((short)uVar15 < sStack_1c4) * sStack_1c4 | ((short)uVar15 >= sStack_1c4) * uVar15;
  local_628._6_2_ =
       (ushort)((short)uVar16 < sStack_1c2) * sStack_1c2 | ((short)uVar16 >= sStack_1c2) * uVar16;
  local_628._8_2_ =
       (ushort)((short)uVar17 < sStack_1c0) * sStack_1c0 | ((short)uVar17 >= sStack_1c0) * uVar17;
  local_628._10_2_ =
       (ushort)((short)uVar18 < sStack_1be) * sStack_1be | ((short)uVar18 >= sStack_1be) * uVar18;
  local_628._12_2_ =
       (ushort)((short)uVar19 < sStack_1bc) * sStack_1bc | ((short)uVar19 >= sStack_1bc) * uVar19;
  local_628._14_2_ =
       (ushort)((short)uVar20 < sStack_1ba) * sStack_1ba | ((short)uVar20 >= sStack_1ba) * uVar20;
  alVar13 = (__m128i)paddsw(local_638,(undefined1  [16])*t80_out);
  _local_658 = auVar21;
  local_5c0 = t80_out;
  local_5a8 = local_758;
  local_5a0 = &local_768;
  local_598 = &local_788;
  local_590 = &local_778;
  local_578 = uStack_680;
  *local_6f0 = alVar13;
  alVar13 = (__m128i)paddsw(local_628,(undefined1  [16])*local_5c0);
  *local_5b8 = alVar13;
  local_9b8[2] = lStack_980;
  uStack_9a0 = 0;
  local_9b8[0] = lStack_990;
  local_9b8[1] = 0;
  highbd_transpose4x8_8x4_low_sse2
            ((__m128i *)(local_9b8 + 2),pq_00,(__m128i *)&local_998,(__m128i *)local_9b8,&local_948,
             &local_958,d2_00,d3_00);
  *(longlong *)(local_8d0 + -4) = local_948[0];
  *(longlong *)(local_8d0 + -4 + (long)local_8d4 * 2) = local_958[0];
  *(longlong *)(local_8d0 + -4 + (long)(local_8d4 * 2) * 2) = local_968[0];
  *(longlong *)(local_8d0 + -4 + (long)(local_8d4 * 3) * 2) = local_978[0];
  return;
}

Assistant:

void aom_highbd_lpf_vertical_4_sse2(uint16_t *s, int p, const uint8_t *blimit,
                                    const uint8_t *limit, const uint8_t *thresh,
                                    int bd) {
  __m128i x0, x1, x2, x3, d0, d1, d2, d3;
  __m128i p1p0, q1q0;
  __m128i p1, q1;

  x0 = _mm_loadl_epi64((__m128i *)(s - 2 + 0 * p));
  x1 = _mm_loadl_epi64((__m128i *)(s - 2 + 1 * p));
  x2 = _mm_loadl_epi64((__m128i *)(s - 2 + 2 * p));
  x3 = _mm_loadl_epi64((__m128i *)(s - 2 + 3 * p));

  highbd_transpose4x8_8x4_low_sse2(&x0, &x1, &x2, &x3, &d0, &d1, &d2, &d3);

  highbd_lpf_internal_4_sse2(&d0, &d1, &d2, &d3, &q1q0, &p1p0, blimit, limit,
                             thresh, bd);

  p1 = _mm_srli_si128(p1p0, 8);
  q1 = _mm_srli_si128(q1q0, 8);

  // transpose from 8x4 to 4x8
  highbd_transpose4x8_8x4_low_sse2(&p1, &p1p0, &q1q0, &q1, &d0, &d1, &d2, &d3);

  _mm_storel_epi64((__m128i *)(s - 2 + 0 * p), d0);
  _mm_storel_epi64((__m128i *)(s - 2 + 1 * p), d1);
  _mm_storel_epi64((__m128i *)(s - 2 + 2 * p), d2);
  _mm_storel_epi64((__m128i *)(s - 2 + 3 * p), d3);
}